

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall
BindPolymerase::BindPolymerase
          (BindPolymerase *this,double rate_constant,double volume,string *promoter_name,
          Polymerase *pol_template)

{
  Polymerase *pol_template_local;
  string *promoter_name_local;
  double volume_local;
  double rate_constant_local;
  BindPolymerase *this_local;
  
  Bind::Bind(&this->super_Bind,rate_constant,volume,promoter_name);
  (this->super_Bind).super_Reaction._vptr_Reaction = (_func_int **)&PTR_CalculatePropensity_002aa930
  ;
  Polymerase::Polymerase(&this->pol_template_,pol_template);
  (this->super_Bind).rate_constant_ = (this->super_Bind).rate_constant_ / (volume * 6.0221409e+23);
  return;
}

Assistant:

BindPolymerase::BindPolymerase(double rate_constant, double volume,
                               const std::string &promoter_name,
                               const Polymerase &pol_template)
    : Bind(rate_constant, volume, promoter_name), pol_template_(pol_template) {
  rate_constant_ = rate_constant_ / (AVAGADRO * volume);
}